

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int isDate(sqlite3_context *context,int argc,sqlite3_value **argv,DateTime *p)

{
  char cVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  Mem *pVal;
  double dVar5;
  sqlite3_context *context_00;
  sqlite3_value **ppsVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  byte *pbVar10;
  ulong uVar11;
  size_t sVar12;
  int iVar13;
  char *pcVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  byte *pbVar18;
  uint uVar19;
  char *zDate;
  float *pfVar20;
  ulong uVar21;
  bool bVar22;
  int Y;
  int M;
  double r;
  double local_a0;
  sqlite3_context *local_98;
  sqlite3_value **local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  double local_78;
  int local_70;
  int local_6c;
  DateTime local_68;
  ulong local_38;
  
  p->s = 0.0;
  p->validJD = '\0';
  p->rawS = '\0';
  p->validYMD = '\0';
  p->validHMS = '\0';
  p->validTZ = '\0';
  p->tzSet = '\0';
  p->isError = '\0';
  p->field_0x2f = 0;
  p->D = 0;
  p->h = 0;
  p->m = 0;
  p->tz = 0;
  p->iJD = 0;
  p->Y = 0;
  p->M = 0;
  if (argc == 0) {
    iVar7 = sqlite3NotPureFunc(context);
    if (iVar7 == 0) {
      return 1;
    }
    iVar7 = setDateTimeToCurrent(context,p);
    return iVar7;
  }
  uVar17 = (ulong)(uint)argc;
  pVal = *argv;
  local_98 = context;
  if ("\x04\x05\x03\x05\x01\x05\x01\x05\x02\x05\x02\x05\x01\x05\x01\x05\x04\x05\x03\x05\x01\x05\x01\x05\x02\x05\x02\x05\x01\x05\x01\x05\x02\x05\x03\x05\x02\x05\x02\x05\x02\x05\x02\x05\x02\x05\x02\x05\x04\x05\x03\x05\x02\x05\x02\x05\x02\x05\x02\x05\x02\x05\x02\x05"
      [pVal->flags & 0x3f] - 1 < 2) {
    dVar5 = sqlite3VdbeRealValue(pVal);
    p->s = dVar5;
    p->rawS = '\x01';
    if ((0.0 <= dVar5) && (dVar5 < 5373484.5)) {
      p->iJD = (long)(dVar5 * 86400000.0 + 0.5);
      p->validJD = '\x01';
    }
    goto LAB_001bbdff;
  }
  pcVar14 = (char *)sqlite3ValueText(pVal,'\x01');
  if (pcVar14 == (char *)0x0) {
    return 1;
  }
  cVar1 = *pcVar14;
  uVar21 = (ulong)(cVar1 == '-');
  local_90 = argv;
  iVar7 = getDigits(pcVar14 + uVar21,"40f-21a-21d",&local_a0,&local_6c,&local_70);
  if (iVar7 == 3) {
    zDate = pcVar14 + uVar21 + 9;
    do {
      do {
        pbVar10 = (byte *)(zDate + 1);
        zDate = zDate + 1;
      } while ((ulong)*pbVar10 == 0x54);
    } while ((""[*pbVar10] & 1) != 0);
    iVar7 = parseHhMmSs(zDate,p);
    if (iVar7 != 0) {
      if (*zDate != '\0') goto LAB_001bbcc8;
      p->validHMS = '\0';
    }
    p->validJD = '\0';
    p->validYMD = '\x01';
    iVar7 = -local_a0._0_4_;
    if (cVar1 != '-') {
      iVar7 = local_a0._0_4_;
    }
    p->Y = iVar7;
    p->M = local_6c;
    p->D = local_70;
    argv = local_90;
    if (p->validTZ != '\0') {
      computeJD(p);
      argv = local_90;
    }
  }
  else {
LAB_001bbcc8:
    iVar7 = parseHhMmSs(pcVar14,p);
    argv = local_90;
    context_00 = local_98;
    if (iVar7 != 0) {
      lVar15 = 0;
      do {
        bVar2 = pcVar14[lVar15];
        bVar3 = "now"[lVar15];
        if (bVar2 == bVar3) {
          if ((ulong)bVar2 == 0) goto LAB_001bbd1a;
        }
        else if (""[bVar2] != ""[bVar3]) goto LAB_001bbd1a;
        lVar15 = lVar15 + 1;
      } while( true );
    }
  }
LAB_001bbdff:
  if (argc < 2) {
LAB_001bc844:
    computeJD(p);
    uVar19 = 1;
    if (p->isError == '\0') {
      uVar19 = (uint)(0x1a6401072fdff < (ulong)p->iJD);
    }
    return uVar19;
  }
  uVar21 = 1;
  local_90 = argv;
  local_38 = uVar17;
LAB_001bbe21:
  ppsVar6 = local_90;
  pbVar10 = (byte *)sqlite3ValueText(local_90[uVar21],'\x01');
  sqlite3ValueBytes(ppsVar6[uVar21],'\x01');
  if (pbVar10 == (byte *)0x0) {
    return 1;
  }
  bVar2 = *pbVar10;
  bVar3 = ""[bVar2];
  uVar8 = 1;
  uVar19 = (uint)bVar3;
  if (bVar3 < 0x6c) {
    uVar11 = (ulong)(uVar19 - 0x2b);
    if (0x3f < uVar19 - 0x2b) goto LAB_001bc6ea;
    if ((0x7fe5UL >> (uVar11 & 0x3f) & 1) == 0) {
      if (uVar11 == 0x36) {
        lVar15 = 0;
        do {
          bVar2 = pbVar10[lVar15];
          bVar3 = "auto"[lVar15];
          if (bVar2 == bVar3) {
            if ((ulong)bVar2 == 0) goto LAB_001bc2ca;
          }
          else if (""[bVar2] != ""[bVar3]) goto LAB_001bc2ca;
          lVar15 = lVar15 + 1;
        } while( true );
      }
      if (uVar11 == 0x3f) {
        lVar15 = 0;
        do {
          bVar2 = pbVar10[lVar15];
          bVar3 = "julianday"[lVar15];
          if (bVar2 == bVar3) {
            if ((ulong)bVar2 == 0) goto LAB_001bc353;
          }
          else if (""[bVar2] != ""[bVar3]) goto LAB_001bc353;
          lVar15 = lVar15 + 1;
        } while( true );
      }
      goto LAB_001bc6ea;
    }
    lVar15 = 1;
    pbVar18 = pbVar10;
    while( true ) {
      bVar3 = pbVar10[lVar15];
      uVar17 = (ulong)bVar3;
      if (((bVar3 == 0) || (bVar3 == 0x3a)) || ((""[uVar17] & 1) != 0)) break;
      lVar15 = lVar15 + 1;
      pbVar18 = pbVar18 + 1;
    }
    iVar7 = sqlite3AtoF((char *)pbVar10,&local_a0,(int)lVar15,'\x01');
    if (iVar7 < 1) {
LAB_001bc5e2:
      uVar8 = 1;
      goto LAB_001bc6ea;
    }
    if (bVar3 != 0x3a) {
      do {
        pbVar10 = pbVar18 + 1;
        pbVar18 = pbVar18 + 1;
      } while ((""[*pbVar10] & 1) != 0);
      sVar12 = strlen((char *)pbVar18);
      uVar19 = (uint)sVar12 & 0x3fffffff;
      uVar8 = 1;
      if (0xfffffff7 < uVar19 - 0xb) {
        if ((pbVar18[uVar19 - 1] & 0xdf) == 0x53) {
          uVar19 = uVar19 - 1;
        }
        computeJD(p);
        local_88._0_4_ = SUB84(local_a0,0);
        local_88._4_4_ = (undefined4)((ulong)local_a0 >> 0x20);
        uStack_80 = 0;
        local_78 = *(double *)(&DAT_001e4f90 + (ulong)(local_a0 < 0.0) * 8);
        pfVar20 = &aXformType[0].rXform;
        uVar17 = 0;
        do {
          if (((uVar19 == ((anon_struct_16_4_82cfffc4 *)(pfVar20 + -3))->nName) &&
              (iVar7 = sqlite3_strnicmp((char *)((long)pfVar20 + -0xb),(char *)pbVar18,uVar19),
              iVar7 == 0)) &&
             (((double)-pfVar20[-1] < (double)CONCAT44(local_88._4_4_,(undefined4)local_88) &&
              (dVar5 = (double)pfVar20[-1],
              (double)CONCAT44(local_88._4_4_,(undefined4)local_88) <= dVar5 &&
              dVar5 != (double)CONCAT44(local_88._4_4_,(undefined4)local_88))))) {
            if ((int)uVar17 == 5) {
              dVar5 = (double)CONCAT44(local_88._4_4_,(undefined4)local_88);
              uVar17 = (ulong)(uint)(int)dVar5;
              computeYMD(p);
              computeHMS(p);
              p->Y = p->Y + (int)dVar5;
              p->validJD = '\0';
              iVar7 = (int)(double)CONCAT44(local_88._4_4_,(undefined4)local_88);
LAB_001bc801:
              local_a0 = (double)CONCAT44(local_88._4_4_,(undefined4)local_88) - (double)iVar7;
            }
            else if ((int)uVar17 == 4) {
              computeYMD(p);
              computeHMS(p);
              iVar7 = (int)(double)CONCAT44(local_88._4_4_,(undefined4)local_88);
              iVar4 = p->M;
              iVar13 = iVar4 + iVar7;
              p->M = iVar13;
              if (iVar13 == 0 || SCARRY4(iVar4,iVar7) != iVar13 < 0) {
                uVar19 = (iVar13 + -0xc) / 0xc;
              }
              else {
                uVar19 = (iVar13 - 1U) / 0xc;
              }
              p->Y = p->Y + uVar19;
              p->M = iVar13 + uVar19 * -0xc;
              p->validJD = '\0';
              goto LAB_001bc801;
            }
            computeJD(p);
            p->iJD = p->iJD + (long)((double)*pfVar20 * local_a0 * 1000.0 + local_78);
            uVar8 = 0;
            goto LAB_001bc071;
          }
          uVar17 = uVar17 + 1;
          pfVar20 = pfVar20 + 4;
        } while (uVar17 != 6);
        uVar8 = 1;
LAB_001bc071:
        p->validYMD = '\0';
        p->validHMS = '\0';
        p->validTZ = '\0';
      }
      goto LAB_001bc6ea;
    }
    local_68.s = 0.0;
    local_68.validJD = '\0';
    local_68.rawS = '\0';
    local_68.validYMD = '\0';
    local_68.validHMS = '\0';
    local_68.validTZ = '\0';
    local_68.tzSet = '\0';
    local_68.isError = '\0';
    local_68._47_1_ = 0;
    local_68.D = 0;
    local_68.h = 0;
    local_68.m = 0;
    local_68.tz = 0;
    local_68.iJD = 0;
    local_68.Y = 0;
    local_68.M = 0;
    iVar7 = parseHhMmSs((char *)(pbVar10 + ((ulong)bVar2 - 0x3a < 0xfffffffffffffff6)),&local_68);
    uVar8 = 1;
    if (iVar7 != 0) goto LAB_001bc6ea;
    computeJD(&local_68);
    local_68.iJD = (local_68.iJD + -43200000) % 86400000;
    if (*pbVar10 == 0x2d) {
      local_68.iJD = -local_68.iJD;
    }
    computeJD(p);
    p->validYMD = '\0';
    p->validHMS = '\0';
    p->validTZ = '\0';
    p->iJD = p->iJD + local_68.iJD;
    goto LAB_001bc6e7;
  }
  if (bVar3 < 0x75) {
    if (uVar19 == 0x6c) {
      lVar15 = 0;
      do {
        bVar2 = pbVar10[lVar15];
        bVar3 = "localtime"[lVar15];
        if (bVar2 == bVar3) {
          if ((ulong)bVar2 == 0) goto LAB_001bc203;
        }
        else if (""[bVar2] != ""[bVar3]) goto LAB_001bc203;
        lVar15 = lVar15 + 1;
      } while( true );
    }
    if (uVar19 == 0x73) {
      pbVar18 = pbVar10 + 9;
      lVar15 = 9;
      pcVar14 = "start of ";
      lVar16 = 0;
      do {
        if ((ulong)*pbVar10 == 0) {
          pcVar14 = "start of " + lVar16;
          goto LAB_001bc5fa;
        }
        if (""[*pbVar10] != ""[(byte)*pcVar14]) goto LAB_001bc5fa;
        pbVar10 = pbVar10 + 1;
        lVar16 = lVar16 + 1;
        pcVar14 = (char *)((byte *)pcVar14 + 1);
        lVar15 = lVar15 + -1;
      } while (lVar15 != 0);
      lVar15 = 0;
      pcVar14 = "";
      pbVar10 = pbVar18;
LAB_001bc5fa:
      if ((((int)lVar15 < 1) || (""[*pbVar10] == ""[(byte)*pcVar14])) &&
         ((p->validJD != '\0' || ((p->validYMD != '\0' || (p->validHMS != '\0')))))) {
        computeYMD(p);
        p->validHMS = '\x01';
        p->validTZ = '\0';
        p->h = 0;
        p->m = 0;
        p->s = 0.0;
        p->validJD = '\0';
        p->rawS = '\0';
        lVar15 = 0;
        do {
          bVar2 = pbVar18[lVar15];
          bVar3 = "month"[lVar15];
          if (bVar2 == bVar3) {
            if ((ulong)bVar2 == 0) goto LAB_001bc68f;
          }
          else if (""[bVar2] != ""[bVar3]) goto LAB_001bc68f;
          lVar15 = lVar15 + 1;
        } while( true );
      }
    }
  }
  else if (uVar19 == 0x77) {
    pbVar18 = pbVar10 + 8;
    lVar15 = 8;
    pcVar14 = "weekday ";
    lVar16 = 0;
    do {
      if ((ulong)*pbVar10 == 0) {
        pcVar14 = "weekday " + lVar16;
        goto LAB_001bc4ad;
      }
      if (""[*pbVar10] != ""[(byte)*pcVar14]) goto LAB_001bc4ad;
      pbVar10 = pbVar10 + 1;
      lVar16 = lVar16 + 1;
      pcVar14 = (char *)((byte *)pcVar14 + 1);
      lVar15 = lVar15 + -1;
    } while (lVar15 != 0);
    lVar15 = 0;
    pcVar14 = "";
    pbVar10 = pbVar18;
LAB_001bc4ad:
    if (((int)lVar15 < 1) || (""[*pbVar10] == ""[(byte)*pcVar14])) {
      sVar12 = strlen((char *)pbVar18);
      iVar7 = sqlite3AtoF((char *)pbVar18,&local_a0,(uint)sVar12 & 0x3fffffff,'\x01');
      if ((iVar7 < 1) || (local_a0 < 0.0)) goto LAB_001bc5e2;
      uVar8 = 1;
      if (local_a0 < 7.0) {
        if ((local_a0 == (double)(int)local_a0) && (!NAN(local_a0) && !NAN((double)(int)local_a0)))
        {
          uVar19 = (uint)local_a0;
          uVar17 = (ulong)uVar19;
          computeYMD(p);
          computeHMS(p);
          p->validTZ = '\0';
          p->validJD = '\0';
          computeJD(p);
          uVar8 = 0;
          lVar15 = (p->iJD + 0x7b98a00) / 86400000;
          lVar16 = (lVar15 / 7) * -7 + -7 + lVar15;
          if (lVar15 % 7 <= (long)(int)uVar19) {
            lVar16 = lVar15 % 7;
          }
          p->iJD = ((int)uVar19 - lVar16) * 86400000 + p->iJD;
          p->validYMD = '\0';
          p->validHMS = '\0';
          p->validTZ = '\0';
        }
      }
    }
  }
  else if (uVar19 == 0x75) {
    lVar15 = 0;
    do {
      bVar2 = pbVar10[lVar15];
      bVar3 = "unixepoch"[lVar15];
      if (bVar2 == bVar3) {
        if ((ulong)bVar2 == 0) goto LAB_001bc239;
      }
      else if (""[bVar2] != ""[bVar3]) goto LAB_001bc239;
      lVar15 = lVar15 + 1;
    } while( true );
  }
  goto LAB_001bc6ea;
LAB_001bbd1a:
  if ((bVar2 == bVar3) && (iVar7 = sqlite3NotPureFunc(local_98), iVar7 != 0)) {
    iVar7 = setDateTimeToCurrent(context_00,p);
    if (iVar7 != 0) {
      return 1;
    }
  }
  else {
    sVar12 = strlen(pcVar14);
    iVar7 = sqlite3AtoF(pcVar14,(double *)&local_68,(uint)sVar12 & 0x3fffffff,'\x01');
    if (iVar7 < 1) {
      return 1;
    }
    p->s = (double)local_68.iJD;
    p->rawS = '\x01';
    if ((0.0 <= (double)local_68.iJD) && ((double)local_68.iJD < 5373484.5)) {
      p->iJD = (long)((double)local_68.iJD * 86400000.0 + 0.5);
      p->validJD = '\x01';
    }
  }
  goto LAB_001bbdff;
LAB_001bc2ca:
  if ((1 < uVar21) || (bVar2 != bVar3)) goto LAB_001bc6ea;
  if ((p->rawS == '\0') || (p->validJD != '\0')) goto LAB_001bc381;
  dVar5 = p->s;
  if ((dVar5 < -210866760000.0) || (253402300799.0 < dVar5)) goto LAB_001bc6ea;
  local_a0 = dVar5 * 1000.0 + 210866760000000.0;
  goto LAB_001bc32f;
LAB_001bc353:
  if ((((1 < uVar21) || (bVar2 != bVar3)) || (p->validJD == '\0')) || (p->rawS == '\0'))
  goto LAB_001bc6ea;
LAB_001bc381:
  p->rawS = '\0';
  goto LAB_001bc6e7;
LAB_001bc239:
  if ((bVar2 != bVar3) || (p->rawS == '\0')) {
    lVar15 = 0;
    do {
      bVar2 = pbVar10[lVar15];
      bVar3 = "utc"[lVar15];
      if (bVar2 == bVar3) {
        if ((ulong)bVar2 == 0) goto LAB_001bc3b1;
      }
      else if (""[bVar2] != ""[bVar3]) goto LAB_001bc3b1;
      lVar15 = lVar15 + 1;
    } while( true );
  }
  if (((1 < uVar21) || (local_a0 = p->s * 1000.0 + 210866760000000.0, local_a0 < 0.0)) ||
     (464269060800000.0 <= local_a0)) goto LAB_001bc6ea;
LAB_001bc32f:
  p->validTZ = '\0';
  p->iJD = (long)(local_a0 + 0.5);
  p->validJD = '\x01';
  p->rawS = '\0';
  p->validYMD = '\0';
  p->validHMS = '\0';
  goto LAB_001bc6e7;
LAB_001bc3b1:
  if (bVar2 != bVar3) goto LAB_001bc6ea;
  iVar7 = sqlite3NotPureFunc(local_98);
  uVar8 = 1;
  if ((iVar7 == 0) || (uVar8 = 0, p->tzSet != '\0')) goto LAB_001bc6ea;
  computeJD(p);
  local_88 = (double)p->iJD;
  iVar7 = 0;
  uVar19 = 0;
  local_78 = local_88;
  do {
    local_68.Y = 0;
    local_68.M = 0;
    local_68.s = 0.0;
    local_68.D = 0;
    local_68.h = 0;
    local_68.m = 0;
    local_68.tz = 0;
    local_68.iJD = (long)local_88 - (long)iVar7;
    local_68.validJD = '\x01';
    local_68.rawS = '\0';
    local_68.validYMD = '\0';
    local_68.validHMS = '\0';
    local_68.validTZ = '\0';
    local_68.tzSet = '\0';
    local_68.isError = '\0';
    local_68._47_1_ = 0;
    local_88 = (double)local_68.iJD;
    uVar9 = toLocaltime(&local_68,local_98);
    uVar11 = (ulong)uVar9;
    if (uVar9 == 0) {
      computeJD(&local_68);
      iVar7 = (int)local_68.iJD - local_78._0_4_;
      uVar11 = uVar17 & 0xffffffff;
    }
    uVar8 = (uint)uVar11;
    if (uVar9 != 0) goto LAB_001bc6ea;
  } while ((iVar7 != 0) && (bVar22 = uVar19 < 3, uVar17 = uVar11, uVar19 = uVar19 + 1, bVar22));
  p->iJD = 0;
  p->Y = 0;
  p->M = 0;
  p->s = 0.0;
  p->validJD = '\0';
  p->rawS = '\0';
  p->validYMD = '\0';
  p->validHMS = '\0';
  p->validTZ = '\0';
  p->tzSet = '\0';
  p->isError = '\0';
  p->field_0x2f = 0;
  p->D = 0;
  p->h = 0;
  p->m = 0;
  p->tz = 0;
  p->iJD = (sqlite3_int64)local_88;
  p->validJD = '\x01';
  p->tzSet = '\x01';
  goto LAB_001bc6e7;
LAB_001bc203:
  if (bVar2 == bVar3) {
    iVar7 = sqlite3NotPureFunc(local_98);
    uVar8 = 1;
    if (iVar7 != 0) {
      uVar8 = toLocaltime(p,local_98);
    }
  }
  goto LAB_001bc6ea;
LAB_001bc68f:
  if (bVar2 != bVar3) {
    lVar15 = 0;
    do {
      bVar2 = pbVar18[lVar15];
      bVar3 = "year"[lVar15];
      if (bVar2 == bVar3) {
        if ((ulong)bVar2 == 0) goto LAB_001bc6cd;
      }
      else if (""[bVar2] != ""[bVar3]) goto LAB_001bc6cd;
      lVar15 = lVar15 + 1;
    } while( true );
  }
  p->D = 1;
  goto LAB_001bc6e7;
LAB_001bc6cd:
  if (bVar2 != bVar3) {
    lVar15 = 0;
    do {
      bVar2 = pbVar18[lVar15];
      bVar3 = "julianday"[lVar15 + 6];
      if (bVar2 == bVar3) {
        if ((ulong)bVar2 == 0) goto LAB_001bc77b;
      }
      else if (""[bVar2] != ""[bVar3]) goto LAB_001bc77b;
      lVar15 = lVar15 + 1;
    } while( true );
  }
  p->M = 1;
  p->D = 1;
LAB_001bc6e7:
  uVar8 = 0;
LAB_001bc6ea:
  if (uVar8 != 0) {
    return 1;
  }
  uVar21 = uVar21 + 1;
  if (uVar21 == local_38) goto LAB_001bc844;
  goto LAB_001bbe21;
LAB_001bc77b:
  uVar8 = (uint)(bVar2 != bVar3);
  goto LAB_001bc6ea;
}

Assistant:

static int isDate(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv,
  DateTime *p
){
  int i, n;
  const unsigned char *z;
  int eType;
  memset(p, 0, sizeof(*p));
  if( argc==0 ){
    if( !sqlite3NotPureFunc(context) ) return 1;
    return setDateTimeToCurrent(context, p);
  }
  if( (eType = sqlite3_value_type(argv[0]))==SQLITE_FLOAT
                   || eType==SQLITE_INTEGER ){
    setRawDateNumber(p, sqlite3_value_double(argv[0]));
  }else{
    z = sqlite3_value_text(argv[0]);
    if( !z || parseDateOrTime(context, (char*)z, p) ){
      return 1;
    }
  }
  for(i=1; i<argc; i++){
    z = sqlite3_value_text(argv[i]);
    n = sqlite3_value_bytes(argv[i]);
    if( z==0 || parseModifier(context, (char*)z, n, p, i) ) return 1;
  }
  computeJD(p);
  if( p->isError || !validJulianDay(p->iJD) ) return 1;
  return 0;
}